

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret0.cxx
# Opt level: O0

int main(int ac,char **av)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  string local_110 [32];
  int local_f0;
  allocator<char> local_e9;
  string local_e8 [8];
  string arg;
  undefined1 local_c0 [4];
  int i;
  string logfile;
  string local_98 [7];
  bool nextarg;
  string logarg;
  string local_70 [8];
  string exename;
  char **argv;
  undefined1 local_30 [4];
  int argc;
  CommandLineArguments args;
  char **av_local;
  int ac_local;
  
  av_local._4_4_ = 0;
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = av;
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)local_30,ac,av);
  iVar2 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  exename.field_2._8_8_ =
       cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  pcVar1 = *(char **)exename.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,pcVar1,(allocator<char> *)(logarg.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(logarg.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_98);
  logfile.field_2._M_local_buf[0xf] = '\0';
  lVar3 = std::__cxx11::string::find((char *)local_70,0x119004);
  if (lVar3 == -1) {
    lVar3 = std::__cxx11::string::find((char *)local_70,0x119019);
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::find((char *)local_70,0x119020);
      if (lVar3 != -1) {
        logfile.field_2._M_local_buf[0xf] = '\x01';
        std::__cxx11::string::operator=(local_98,"/X");
      }
    }
    else {
      std::__cxx11::string::operator=(local_98,"-log-file=");
    }
  }
  else {
    std::__cxx11::string::operator=(local_98,"--log-file=");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string((string *)local_c0);
    for (arg.field_2._12_4_ = 1; (int)arg.field_2._12_4_ < iVar2;
        arg.field_2._12_4_ = arg.field_2._12_4_ + 1) {
      pcVar1 = *(char **)(exename.field_2._8_8_ + (long)(int)arg.field_2._12_4_ * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e8,pcVar1,&local_e9);
      std::allocator<char>::~allocator(&local_e9);
      lVar3 = std::__cxx11::string::find(local_e8,(ulong)local_98);
      if (lVar3 == 0) {
        if ((logfile.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_110,(ulong)local_e8);
          std::__cxx11::string::operator=((string *)local_c0,local_110);
          std::__cxx11::string::~string(local_110);
          goto LAB_0010600e;
        }
        if (arg.field_2._12_4_ != iVar2 + -1) {
          std::__cxx11::string::operator=
                    ((string *)local_c0,
                     *(char **)(exename.field_2._8_8_ + 8 + (long)(int)arg.field_2._12_4_ * 8));
          goto LAB_0010600e;
        }
        av_local._4_4_ = 1;
        local_f0 = 1;
      }
      else {
LAB_0010600e:
        local_f0 = 0;
      }
      std::__cxx11::string::~string(local_e8);
      if (local_f0 != 0) goto LAB_00106083;
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cmsys::SystemTools::Touch((string *)local_c0,true);
    }
    local_f0 = 0;
LAB_00106083:
    std::__cxx11::string::~string((string *)local_c0);
    if (local_f0 != 0) goto LAB_001060bc;
  }
  av_local._4_4_ = 0;
  local_f0 = 1;
LAB_001060bc:
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return av_local._4_4_;
}

Assistant:

int main(int ac, char** av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;

  if (exename.find("valgrind") != std::string::npos) {
    logarg = "--log-file=";
  } else if (exename.find("purify") != std::string::npos) {
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  } else if (exename.find("BC") != std::string::npos) {
    nextarg = true;
    logarg = "/X";
  }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0) {
        if (nextarg) {
          if (i == argc - 1) {
            return 1; // invalid command line
          }
          logfile = argv[i + 1];
        } else {
          logfile = arg.substr(logarg.length());
        }
        // keep searching, it may be overridden later to provoke an error
      }
    }

    if (!logfile.empty()) {
      cmSystemTools::Touch(logfile, true);
    }
  }

  return RETVAL;
}